

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

uint32 * __thiscall
google::protobuf::internal::GeneratedMessageReflection::GetHasBits
          (GeneratedMessageReflection *this,Message *message)

{
  Message *message_00;
  bool bVar1;
  uint32 offset;
  LogMessage *other;
  uint *puVar2;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  Message *local_18;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  local_18 = message;
  message_local = (Message *)this;
  bVar1 = ReflectionSchema::HasHasbits(&this->schema_);
  local_51 = 0;
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x776);
    local_51 = 1;
    other = LogMessage::operator<<(&local_50,"CHECK failed: schema_.HasHasbits(): ");
    LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    LogMessage::~LogMessage(&local_50);
  }
  message_00 = local_18;
  offset = ReflectionSchema::HasBitsOffset(&this->schema_);
  puVar2 = anon_unknown_0::GetConstRefAtOffset<unsigned_int>(message_00,offset);
  return puVar2;
}

Assistant:

inline const uint32* GeneratedMessageReflection::GetHasBits(
    const Message& message) const {
  GOOGLE_DCHECK(schema_.HasHasbits());
  return &GetConstRefAtOffset<uint32>(message, schema_.HasBitsOffset());
}